

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageDestOperator::process
          (MessageDestOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  long lVar1;
  long *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl != (Message *)0x0) {
    lVar1 = *in_RDX;
    if (*(long *)(lVar1 + 0xd8) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar1 + 0xd0)
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (lVar1 + 0x70));
    }
    if (message[3]._M_t.
        super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
        super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl == (Message *)0x0) {
      std::__throw_bad_function_call();
    }
    (*(code *)message[4]._M_t.
              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
              super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)
              (&local_40,message + 1,*in_RDX + 0x90,*in_RDX + 0x70);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x70)
               ,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageDestOperator::process(std::unique_ptr<Message> message)
{
    if (DestUpdateFunction) {
        if (message->original_dest.empty()) {
            message->original_dest = message->dest;
        }
        message->dest = DestUpdateFunction(message->source, message->dest);
    }
    return message;
}